

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

Variant * Jinx::operator+(Variant *__return_storage_ptr__,Variant *left,Variant *right)

{
  ValueType VVar1;
  int64_t iVar2;
  int64_t iVar3;
  double dVar4;
  double dVar5;
  String local_98;
  String local_68;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_48;
  undefined1 local_21;
  Variant *local_20;
  Variant *right_local;
  Variant *left_local;
  Variant *result;
  
  local_20 = right;
  right_local = left;
  left_local = __return_storage_ptr__;
  VVar1 = Variant::GetType(left);
  if (VVar1 == String) {
    local_21 = 0;
    Variant::Variant(__return_storage_ptr__);
    Variant::GetString_abi_cxx11_(&local_68,right_local);
    Variant::GetString_abi_cxx11_(&local_98,local_20);
    std::operator+(&local_48,&local_68,&local_98);
    Variant::SetString(__return_storage_ptr__,&local_48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_98);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_68);
  }
  else {
    VVar1 = Variant::GetType(right_local);
    if ((VVar1 == Number) || (VVar1 = Variant::GetType(right_local), VVar1 == Integer)) {
      VVar1 = Variant::GetType(local_20);
      if ((VVar1 == Number) || (VVar1 = Variant::GetType(local_20), VVar1 == Integer)) {
        VVar1 = Variant::GetType(right_local);
        if ((VVar1 == Integer) && (VVar1 = Variant::GetType(local_20), VVar1 == Integer)) {
          Variant::Variant(__return_storage_ptr__);
          iVar2 = Variant::GetInteger(right_local);
          iVar3 = Variant::GetInteger(local_20);
          Variant::SetInteger(__return_storage_ptr__,iVar2 + iVar3);
        }
        else {
          Variant::Variant(__return_storage_ptr__);
          dVar4 = Variant::GetNumber(right_local);
          dVar5 = Variant::GetNumber(local_20);
          Variant::SetNumber(__return_storage_ptr__,dVar4 + dVar5);
        }
      }
      else {
        Impl::LogWriteLine(Error,"Invalid right operand for addition");
        Variant::Variant(__return_storage_ptr__);
      }
    }
    else {
      Impl::LogWriteLine(Error,"Invalid left operand for addition");
      Variant::Variant(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant operator + (const Variant & left, const Variant & right)
	{
		if (left.GetType() == ValueType::String)
		{
			Variant result;
			result.SetString(left.GetString() + right.GetString());
			return result;
		}
		if (left.GetType() != ValueType::Number && left.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid left operand for addition");
			return Variant();
		}
		if (right.GetType() != ValueType::Number && right.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid right operand for addition");
			return Variant();
		}
		if (left.GetType() == ValueType::Integer && right.GetType() == ValueType::Integer)
		{
			Variant result;
			result.SetInteger(left.GetInteger() + right.GetInteger());
			return result;
		}
		else
		{
			Variant result;
			result.SetNumber(left.GetNumber() + right.GetNumber());
			return result;
		}
	}